

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnginput.cc
# Opt level: O3

void __thiscall PngInput::PngInput(PngInput *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"png","");
  ImageInput::ImageInput(&this->super_ImageInput,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_ImageInput)._vptr_ImageInput = (_func_int **)&PTR__PngInput_0025f8e8;
  (this->pngBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->pngBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->pngBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lodepng::State::State(&this->state);
  this->colorConvert = false;
  this->nextScanline = 0;
  this->decodingBegun = false;
  return;
}

Assistant:

PngInput() : ImageInput("png") {}